

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synced_bcf_reader.c
# Opt level: O0

int bcf_sr_seek(bcf_srs_t *readers,char *seq,int pos)

{
  int iVar1;
  int local_2c;
  int local_28;
  int nret;
  int i;
  int pos_local;
  char *seq_local;
  bcf_srs_t *readers_local;
  
  if ((seq == (char *)0x0) && (pos == 0)) {
    bcf_sr_seek_start(readers);
    readers_local._4_4_ = 0;
  }
  else {
    bcf_sr_regions_overlap(readers->regions,seq,pos,pos);
    local_2c = 0;
    for (local_28 = 0; local_28 < readers->nreaders; local_28 = local_28 + 1) {
      iVar1 = _reader_seek(readers->readers + local_28,seq,pos,0x7ffffffe);
      local_2c = iVar1 + local_2c;
    }
    readers_local._4_4_ = local_2c;
  }
  return readers_local._4_4_;
}

Assistant:

int bcf_sr_seek(bcf_srs_t *readers, const char *seq, int pos)
{
    if ( !seq && !pos )
    {
        // seek to start
        bcf_sr_seek_start(readers);
        return 0;
    }

    bcf_sr_regions_overlap(readers->regions, seq, pos, pos);
    int i, nret = 0;
    for (i=0; i<readers->nreaders; i++)
    {
        nret += _reader_seek(&readers->readers[i],seq,pos,MAX_CSI_COOR-1);
    }
    return nret;
}